

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

Gia_Man_t * Jf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Mem_t *p_00;
  int iVar1;
  Jf_Man_t *p_01;
  char *pName;
  code *pcVar2;
  int local_2c;
  int i;
  Jf_Man_t *p;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManBufNum(pGia);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x6b5,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
  }
  if (((pPars->fCutMin != 0) && (pPars->fFuncDsd != 0)) && (6 < pPars->nLutSize)) {
    __assert_fail("!pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x6b6,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pPars->fGenCnf != 0) {
    pPars->fCutMin = 1;
    pPars->fFuncDsd = 1;
    pPars->fOptEdge = 0;
  }
  if ((pPars->fCutMin != 0) && (pPars->fFuncDsd == 0)) {
    pPars->fCoarsen = 0;
  }
  p_01 = Jf_ManAlloc(pGia,pPars);
  pcVar2 = Jf_CutCompareDelay;
  if (pPars->fAreaOnly != 0) {
    pcVar2 = Jf_CutCompareArea;
  }
  p_01->pCutCmp = pcVar2;
  Jf_ManComputeCuts(p_01,0);
  Jf_ManComputeRefs(p_01);
  Jf_ManPrintStats(p_01,"Start");
  for (local_2c = 0; local_2c < pPars->nRounds; local_2c = local_2c + 1) {
    if (p_01->pPars->fGenCnf == 0) {
      Jf_ManPropagateFlow(p_01,pPars->fOptEdge);
      Jf_ManPrintStats(p_01,"Flow ");
    }
    Jf_ManPropagateEla(p_01,0);
    Jf_ManPrintStats(p_01,"Area ");
    Jf_ManPropagateEla(p_01,1);
    Jf_ManPrintStats(p_01,"Edge ");
  }
  if (((p_01->pPars->fVeryVerbose != 0) && (p_01->pPars->fCutMin != 0)) &&
     (p_01->pPars->fFuncDsd == 0)) {
    p_00 = p_01->vTtMem;
    pName = Gia_ManName(p_01->pGia);
    Vec_MemDumpTruthTables(p_00,pName,p_01->pPars->nLutSize);
  }
  if (p_01->pPars->fPureAig == 0) {
    if (p_01->pPars->fCutMin == 0) {
      Jf_ManDeriveMapping(p_01);
      p = (Jf_Man_t *)pGia;
    }
    else {
      p = (Jf_Man_t *)Jf_ManDeriveMappingGia(p_01);
    }
  }
  else {
    p = (Jf_Man_t *)Jf_ManDeriveGia(p_01);
  }
  Jf_ManFree(p_01);
  return (Gia_Man_t *)p;
}

Assistant:

Gia_Man_t * Jf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = pGia;
    Jf_Man_t * p; int i;
    assert( !Gia_ManBufNum(pGia) );
    assert( !pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6 );
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1, pPars->fFuncDsd = 1, pPars->fOptEdge = 0;
    if ( pPars->fCutMin && !pPars->fFuncDsd )
        pPars->fCoarsen = 0;
    p = Jf_ManAlloc( pGia, pPars );
    p->pCutCmp = pPars->fAreaOnly ? Jf_CutCompareArea : Jf_CutCompareDelay;
    Jf_ManComputeCuts( p, 0 );
    Jf_ManComputeRefs( p );                         Jf_ManPrintStats( p, "Start" );
    for ( i = 0; i < pPars->nRounds; i++ )
    {
        if ( !p->pPars->fGenCnf )
        {
        Jf_ManPropagateFlow( p, pPars->fOptEdge );  Jf_ManPrintStats( p, "Flow " );
        }
        Jf_ManPropagateEla( p, 0 );                 Jf_ManPrintStats( p, "Area " );
        Jf_ManPropagateEla( p, 1 );                 Jf_ManPrintStats( p, "Edge " );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && !p->pPars->fFuncDsd )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), p->pPars->nLutSize );
    if ( p->pPars->fPureAig )
        pNew = Jf_ManDeriveGia(p);
    else if ( p->pPars->fCutMin )
        pNew = Jf_ManDeriveMappingGia(p);
    else
        Jf_ManDeriveMapping(p);
    Jf_ManFree( p );
    return pNew;
}